

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool __thiscall tinyusdz::Prim::add_child(Prim *this,Prim *rhs,bool rename_prim_name,string *err)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  Value *pVVar7;
  Path *pPVar8;
  allocator local_3d1;
  string local_3d0 [32];
  fmt local_3b0 [39];
  allocator local_389;
  string local_388;
  Path local_368;
  allocator local_291;
  string local_290;
  string local_270;
  allocator local_249;
  string local_248 [32];
  fmt local_228 [39];
  allocator local_201;
  string local_200 [32];
  fmt local_1e0 [32];
  undefined1 local_1c0 [8];
  string unique_name;
  ulong local_198;
  size_t i;
  string local_188;
  Path local_168;
  int local_98;
  allocator local_91;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string elementName;
  string *err_local;
  bool rename_prim_name_local;
  Prim *rhs_local;
  Prim *this_local;
  
  elementName.field_2._8_8_ = err;
  psVar2 = element_name_abi_cxx11_(rhs);
  ::std::__cxx11::string::string((string *)local_50,(string *)psVar2);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    if (!rename_prim_name) {
      if (elementName.field_2._8_8_ != 0) {
        ::std::__cxx11::string::operator=
                  ((string *)elementName.field_2._8_8_,"Prim has empty elementName.\n");
      }
      this_local._7_1_ = 0;
      local_98 = 1;
      goto LAB_0037079b;
    }
    ::std::__cxx11::string::operator=((string *)local_50,"default");
    pVVar7 = get_data(rhs);
    bVar1 = SetPrimElementName(pVVar7,(string *)local_50);
    if (!bVar1) {
      if (elementName.field_2._8_8_ != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_90,"Internal error. cannot modify Prim\'s elementName.\n",
                   &local_91);
        fmt::format(&local_70,&local_90);
        ::std::__cxx11::string::operator=((string *)elementName.field_2._8_8_,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      this_local._7_1_ = 0;
      local_98 = 1;
      goto LAB_0037079b;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_188,"",(allocator *)((long)&i + 7));
    Path::Path(&local_168,(string *)local_50,&local_188);
    pPVar8 = element_path(rhs);
    Path::operator=(pPVar8,&local_168);
    Path::~Path(&local_168);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  }
  sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children);
  sVar5 = ::std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->_childrenNameSet);
  if (sVar4 != sVar5) {
    ::std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->_childrenNameSet);
    for (local_198 = 0;
        sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children)
        , local_198 < sVar4; local_198 = local_198 + 1) {
      pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                          &this->_children,local_198);
      element_name_abi_cxx11_(pvVar6);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        if (elementName.field_2._8_8_ != 0) {
          ::std::__cxx11::string::operator=
                    ((string *)elementName.field_2._8_8_,
                     "Internal error: Existing child Prim\'s elementName is empty.\n");
        }
        this_local._7_1_ = 0;
        local_98 = 1;
        goto LAB_0037079b;
      }
      pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                          &this->_children,local_198);
      psVar2 = element_name_abi_cxx11_(pvVar6);
      sVar5 = ::std::
              multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->_childrenNameSet,psVar2);
      if (sVar5 != 0) {
        if (elementName.field_2._8_8_ != 0) {
          ::std::__cxx11::string::operator=
                    ((string *)elementName.field_2._8_8_,
                     "Internal error: _children contains Prim with same elementName.\n");
        }
        this_local._7_1_ = 0;
        local_98 = 1;
        goto LAB_0037079b;
      }
      pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                          &this->_children,local_198);
      psVar2 = element_name_abi_cxx11_(pvVar6);
      unique_name.field_2._8_8_ =
           ::std::
           multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->_childrenNameSet,psVar2);
    }
  }
  sVar5 = ::std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->_childrenNameSet,(key_type_conflict *)local_50);
  if (sVar5 != 0) {
    if (!rename_prim_name) {
      if (elementName.field_2._8_8_ != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3d0,"Prim name(elementName) {} already exists in children.\n",&local_3d1);
        psVar2 = element_name_abi_cxx11_(rhs);
        fmt::format<std::__cxx11::string>
                  (local_3b0,(string *)local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2);
        ::std::__cxx11::string::operator=((string *)elementName.field_2._8_8_,(string *)local_3b0);
        ::std::__cxx11::string::~string((string *)local_3b0);
        ::std::__cxx11::string::~string(local_3d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      }
      this_local._7_1_ = 0;
      local_98 = 1;
      goto LAB_0037079b;
    }
    ::std::__cxx11::string::string((string *)local_1c0);
    bVar1 = makeUniqueName((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&this->_childrenNameSet,(string *)local_50,(string *)local_1c0);
    if (bVar1) {
      bVar1 = ValidatePrimElementName((string *)local_1c0);
      if (bVar1) {
        ::std::__cxx11::string::operator=((string *)local_50,(string *)local_1c0);
        pVVar7 = get_data(rhs);
        bVar1 = SetPrimElementName(pVVar7,(string *)local_50);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_388,"",&local_389);
          Path::Path(&local_368,(string *)local_50,&local_388);
          pPVar8 = element_path(rhs);
          Path::operator=(pPVar8,&local_368);
          Path::~Path(&local_368);
          ::std::__cxx11::string::~string((string *)&local_388);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
          local_98 = 0;
        }
        else {
          if (elementName.field_2._8_8_ != 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_290,"Internal error. cannot modify Prim\'s elementName.\n",
                       &local_291);
            fmt::format(&local_270,&local_290);
            ::std::__cxx11::string::operator=
                      ((string *)elementName.field_2._8_8_,(string *)&local_270);
            ::std::__cxx11::string::~string((string *)&local_270);
            ::std::__cxx11::string::~string((string *)&local_290);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_291);
          }
          this_local._7_1_ = 0;
          local_98 = 1;
        }
      }
      else {
        if (elementName.field_2._8_8_ != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_248,"Internally generated Prim name `{}` is invalid as a Prim name.\n",
                     &local_249);
          fmt::format<std::__cxx11::string>
                    (local_228,(string *)local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0)
          ;
          ::std::__cxx11::string::operator=((string *)elementName.field_2._8_8_,(string *)local_228)
          ;
          ::std::__cxx11::string::~string((string *)local_228);
          ::std::__cxx11::string::~string(local_248);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
        }
        this_local._7_1_ = 0;
        local_98 = 1;
      }
    }
    else {
      if (elementName.field_2._8_8_ != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_200,"Internal error. cannot assign unique name for `{}`.\n",&local_201);
        fmt::format<std::__cxx11::string>
                  (local_1e0,(string *)local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        ::std::__cxx11::string::operator=((string *)elementName.field_2._8_8_,(string *)local_1e0);
        ::std::__cxx11::string::~string((string *)local_1e0);
        ::std::__cxx11::string::~string(local_200);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
      }
      this_local._7_1_ = 0;
      local_98 = 1;
    }
    ::std::__cxx11::string::~string((string *)local_1c0);
    if (local_98 != 0) goto LAB_0037079b;
  }
  ::std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->_childrenNameSet,(value_type_conflict *)local_50);
  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&this->_children,rhs);
  this->_child_dirty = true;
  this_local._7_1_ = 1;
  local_98 = 1;
LAB_0037079b:
  ::std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Prim::add_child(Prim &&rhs, const bool rename_prim_name,
                     std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  std::string elementName = rhs.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {
      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = "Prim has empty elementName.\n";
      }
      return false;
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  DCOUT("elementName = " << elementName);

  if (_childrenNameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_childrenNameSet, elementName, &unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot assign unique name for `{}`.\n",
              elementName);
        }
        return false;
      }

      // Ensure valid Prim name
      if (!ValidatePrimElementName(unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internally generated Prim name `{}` is invalid as a Prim "
              "name.\n",
              unique_name);
        }
        return false;
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      DCOUT("elementName = " << elementName);
      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = fmt::format(
            "Prim name(elementName) {} already exists in children.\n",
            rhs.element_name());
      }
      return false;
    }
  }

  DCOUT("rhs.elementName = " << rhs.element_name());

  _childrenNameSet.insert(elementName);
  _children.emplace_back(std::move(rhs));
  _child_dirty = true;

  return true;
}